

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ForwardTypedefDeclarationSyntax::setChild
          (ForwardTypedefDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00476554 + *(int *)(&DAT_00476554 + index * 4)))();
  return;
}

Assistant:

void ForwardTypedefDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: typedefKeyword = child.token(); return;
        case 2: typeRestriction = child.node() ? &child.node()->as<ForwardTypeRestrictionSyntax>() : nullptr; return;
        case 3: name = child.token(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}